

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_string_tests.cpp
# Opt level: O3

void __thiscall
iu_UnitStringTest_x_iutest_x_OwnWcsicmpNegativeLT_Test::Body
          (iu_UnitStringTest_x_iutest_x_OwnWcsicmpNegativeLT_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  wint_t wVar4;
  wint_t wVar5;
  char *in_R9;
  long lVar6;
  AssertionResult iutest_ar;
  undefined7 in_stack_fffffffffffffd88;
  bool bVar7;
  AssertionResult local_270;
  AssertionHelper local_248;
  ExpressionResult local_218;
  ExpressionLHS<unsigned_long> local_1f0;
  unsigned_long local_1c8 [2];
  undefined1 local_1b8 [32];
  bool local_198;
  ios_base local_138 [264];
  
  local_1c8[1] = 4;
  iutest::detail::ExpressionLHS<unsigned_long>::ExpressionLHS(&local_1f0,local_1c8 + 1);
  local_1c8[0] = 4;
  iutest::detail::ExpressionLHS<unsigned_long>::operator>=(&local_218,&local_1f0,local_1c8);
  bVar7 = true;
  iutest::detail::ExpressionResult::operator&&
            ((ExpressionResult *)&local_248,&local_218,(bool *)&stack0xfffffffffffffd8f);
  iutest::detail::ExpressionResult::GetResult
            ((AssertionResult *)local_1b8,(ExpressionResult *)&local_248,true);
  paVar1 = &local_270.m_message.field_2;
  local_270.m_message._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_270,CONCAT44(local_1b8._4_4_,local_1b8._0_4_),
             local_1b8._8_8_ + CONCAT44(local_1b8._4_4_,local_1b8._0_4_));
  local_270.m_result = local_198;
  if ((undefined1 *)CONCAT44(local_1b8._4_4_,local_1b8._0_4_) != local_1b8 + 0x10) {
    operator_delete((undefined1 *)CONCAT44(local_1b8._4_4_,local_1b8._0_4_),local_1b8._16_8_ + 1);
  }
  paVar2 = &local_248.m_part_result.super_iuCodeMessage.m_message.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_248.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._4_4_,
                  (int)local_248.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p) !=
      paVar2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_248.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p.
                             _4_4_,(int)local_248.m_part_result.super_iuCodeMessage.m_message.
                                        _M_dataplus._M_p),
                    local_248.m_part_result.super_iuCodeMessage.m_message.field_2.
                    _M_allocated_capacity + 1);
  }
  paVar3 = &local_218.m_result.m_message.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218.m_result.m_message._M_dataplus._M_p != paVar3) {
    operator_delete(local_218.m_result.m_message._M_dataplus._M_p,
                    local_218.m_result.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0.m_message._M_dataplus._M_p != &local_1f0.m_message.field_2) {
    operator_delete(local_1f0.m_message._M_dataplus._M_p,
                    local_1f0.m_message.field_2._M_allocated_capacity + 1);
  }
  if (local_270.m_result == false) {
    memset((iu_global_format_stringstream *)local_1b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              ((string *)&local_218,(internal *)&local_270,
               (AssertionResult *)
               "IIUT_TEST_EXPRESSION_EXPAND_EXPRESSION((sizeof(::std::wint_t) >= sizeof(int) && (sizeof(wchar_t) > 2 || ::iutest_type_traits::is_signed<wchar_t>::value)))"
               ,"false","true",in_R9);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_248,local_218.m_result.m_message._M_dataplus._M_p,
               (allocator<char> *)&local_1f0);
    local_248.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
    ;
    local_248.m_part_result.super_iuCodeMessage.m_line = 0x5a;
    local_248.m_part_result.super_iuCodeMessage._44_4_ = 0xfffffffd;
    iutest::AssertionHelper::OnFixed(&local_248,(Fixed *)local_1b8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_248.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._4_4_,
                    (int)local_248.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p) !=
        paVar2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_248.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                               _M_p._4_4_,
                               (int)local_248.m_part_result.super_iuCodeMessage.m_message.
                                    _M_dataplus._M_p),
                      local_248.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218.m_result.m_message._M_dataplus._M_p != paVar3) {
LAB_00153ad4:
      operator_delete(local_218.m_result.m_message._M_dataplus._M_p,
                      local_218.m_result.m_message.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_270.m_message._M_dataplus._M_p,
                      CONCAT71(local_270.m_message.field_2._M_allocated_capacity._1_7_,
                               local_270.m_message.field_2._M_local_buf[0]) + 1);
    }
    local_1b8._0_4_ = 0;
    lVar6 = 0;
    do {
      wVar5 = *(wint_t *)((long)&DAT_0016fd00 + lVar6);
      if (*(wint_t *)((long)L"AAA" + lVar6) == 0) {
        wVar4 = towupper(0);
        wVar5 = towupper(wVar5);
        local_248.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._0_4_ = wVar4 - wVar5
        ;
        break;
      }
      wVar4 = towupper(*(wint_t *)((long)L"AAA" + lVar6));
      wVar5 = towupper(wVar5);
      lVar6 = lVar6 + 4;
      local_248.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._0_4_ = wVar4 - wVar5;
    } while ((int)local_248.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p == 0);
    if (0 < (int)local_248.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p) {
      local_270.m_message._M_dataplus._M_p = (pointer)&local_270.m_message.field_2;
      local_270.m_message._M_string_length = 0;
      local_270.m_message.field_2._M_local_buf[0] = '\0';
      local_270.m_result = true;
      goto LAB_00153b36;
    }
    iutest::internal::CmpHelperOpFailure<int,int>
              (&local_270,(internal *)0x16fae4,
               "::iutest::detail::wrapper::iu_wcsicmp(L\"AAA\", negative_sample)","<",local_1b8,
               (int *)&local_248,(int *)CONCAT17(bVar7,in_stack_fffffffffffffd88));
    if ((local_270.m_result & 1U) != 0) goto LAB_00153b36;
    memset((iu_global_format_stringstream *)local_1b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_248,local_270.m_message._M_dataplus._M_p,
               (allocator<char> *)&local_218);
    local_248.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
    ;
    local_248.m_part_result.super_iuCodeMessage.m_line = 0x5b;
    local_248.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_248,(Fixed *)local_1b8,false);
    local_218.m_result.m_message._M_dataplus._M_p =
         (pointer)CONCAT44(local_248.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p.
                           _4_4_,(int)local_248.m_part_result.super_iuCodeMessage.m_message.
                                      _M_dataplus._M_p);
    local_218.m_result.m_message.field_2._M_allocated_capacity =
         local_248.m_part_result.super_iuCodeMessage.m_message.field_2._M_allocated_capacity;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218.m_result.m_message._M_dataplus._M_p != paVar2) goto LAB_00153ad4;
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
  std::ios_base::~ios_base(local_138);
LAB_00153b36:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270.m_message._M_dataplus._M_p != &local_270.m_message.field_2) {
    operator_delete(local_270.m_message._M_dataplus._M_p,
                    CONCAT71(local_270.m_message.field_2._M_allocated_capacity._1_7_,
                             local_270.m_message.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

IUTEST(UnitStringTest, OwnWcsicmpNegativeLT)
{
    const wchar_t negative = static_cast<wchar_t>(-1);
    const wchar_t negative_sample[] = { L'a', L'a', L'a', negative, L'\0' };
    IUTEST_ASSUME(sizeof(::std::wint_t) >= sizeof(int) && (sizeof(wchar_t) > 2 || ::iutest_type_traits::is_signed<wchar_t>::value));
    IUTEST_EXPECT_LT(0, ::iutest::detail::wrapper::iu_wcsicmp(L"AAA", negative_sample));
}